

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O1

void google::protobuf::internal::PackedFieldHelper<9>::
     Serialize<google::protobuf::internal::ArrayOutput>
               (void *field,FieldMetadata *md,ArrayOutput *output)

{
  LogMessage *pLVar1;
  LogMessage local_58;
  LogFinisher local_19;
  
  LogMessage::LogMessage
            (&local_58,LOGLEVEL_DFATAL,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/generated_message_util.cc"
             ,0x205);
  pLVar1 = LogMessage::operator<<(&local_58,"Not implemented field number ");
  pLVar1 = LogMessage::operator<<(pLVar1,md->tag);
  pLVar1 = LogMessage::operator<<(pLVar1," with type ");
  pLVar1 = LogMessage::operator<<(pLVar1,md->type);
  LogFinisher::operator=(&local_19,pLVar1);
  LogMessage::~LogMessage(&local_58);
  return;
}

Assistant:

static void Serialize(const void* field, const FieldMetadata& md, O* output) {
    GOOGLE_LOG(FATAL) << "Not implemented field number " << md.tag << " with type "
               << md.type;
  }